

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_TlsMgr.cpp
# Opt level: O0

size_t axl::sys::createSimpleTlsSlot(void)

{
  int iVar1;
  int result;
  pthread_key_t key;
  uint_t in_stack_ffffffffffffffec;
  uint in_stack_fffffffffffffff4;
  ulong local_8;
  
  iVar1 = pthread_key_create((pthread_key_t *)&stack0xfffffffffffffff4,(__destr_function *)0x0);
  if (iVar1 == 0) {
    local_8 = (ulong)in_stack_fffffffffffffff4;
  }
  else {
    err::ErrorRef::ErrorRef
              ((ErrorRef *)CONCAT44(in_stack_fffffffffffffff4,iVar1),in_stack_ffffffffffffffec);
    err::setError((ErrorRef *)0x1a4e5a);
    err::ErrorRef::~ErrorRef((ErrorRef *)0x1a4e66);
    local_8 = 0xffffffffffffffff;
  }
  return local_8;
}

Assistant:

size_t
createSimpleTlsSlot() {
	pthread_key_t key;
	int result = ::pthread_key_create(&key, NULL);
	if (result != 0) {
		err::setError(result);
		return -1;
	}

	ASSERT(sizeof(key) <= sizeof(size_t));
	return (size_t)key;
}